

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O3

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,basic_value<toml::type_config> *v)

{
  anon_union_64_11_c2653db1_for_basic_value<toml::type_config>_2 *paVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *__ht;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  *__x;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  value_type_conflict5 vVar5;
  size_type sVar6;
  undefined8 uVar7;
  size_t sVar8;
  uint16_t uVar9;
  uint8_t uVar10;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *this_00;
  long lVar11;
  vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
  *this_01;
  long lVar12;
  long lVar13;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_true>_>_>
  local_38;
  
  this->type_ = v->type_;
  toml::detail::region::region(&this->region_,&v->region_);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->comments_,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&v->comments_);
  paVar1 = &this->field_1;
  switch(this->type_) {
  case boolean:
    paVar1->boolean_ = (v->field_1).boolean_;
    break;
  case integer:
    (this->field_1).integer_.value = (v->field_1).integer_.value;
    uVar9 = *(uint16_t *)((long)&v->field_1 + 10);
    uVar2 = *(undefined4 *)&(v->field_1).offset_datetime_.value.time.nanosecond;
    uVar3 = *(undefined4 *)((long)&v->field_1 + 0x10);
    uVar4 = *(undefined4 *)((long)&v->field_1 + 0x14);
    *(uint16_t *)((long)&this->field_1 + 8) = *(uint16_t *)((long)&v->field_1 + 8);
    *(uint16_t *)((long)&this->field_1 + 10) = uVar9;
    *(undefined4 *)&(this->field_1).offset_datetime_.value.time.nanosecond = uVar2;
    *(undefined4 *)((long)&this->field_1 + 0x10) = uVar3;
    *(undefined4 *)((long)&this->field_1 + 0x14) = uVar4;
    *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) =
         *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
    lVar11 = 0x30;
    lVar12 = 0x38;
    lVar13 = 0x28;
    goto LAB_0024fd6c;
  case floating:
    (this->field_1).integer_.value = (v->field_1).integer_.value;
    uVar9 = *(uint16_t *)((long)&v->field_1 + 10);
    uVar2 = *(undefined4 *)&(v->field_1).offset_datetime_.value.time.nanosecond;
    uVar3 = *(undefined4 *)((long)&v->field_1 + 0x10);
    uVar4 = *(undefined4 *)((long)&v->field_1 + 0x14);
    *(uint16_t *)((long)&this->field_1 + 8) = *(uint16_t *)((long)&v->field_1 + 8);
    *(uint16_t *)((long)&this->field_1 + 10) = uVar9;
    *(undefined4 *)&(this->field_1).offset_datetime_.value.time.nanosecond = uVar2;
    *(undefined4 *)((long)&this->field_1 + 0x10) = uVar3;
    *(undefined4 *)((long)&this->field_1 + 0x14) = uVar4;
    lVar11 = 0x28;
    lVar12 = 0x30;
    lVar13 = 0x20;
LAB_0024fd6c:
    *(value_t **)(&this->type_ + lVar13) = &this->type_ + lVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(&this->type_ + lVar13),*(long *)(&v->type_ + lVar13),
               *(long *)(&v->type_ + lVar11) + *(long *)(&v->type_ + lVar13));
    break;
  case string:
    (this->field_1).integer_.value = (value_type_conflict5)((long)&this->field_1 + 0x10);
    lVar11 = (v->field_1).integer_.value;
    std::__cxx11::string::_M_construct<char*>
              ((string *)paVar1,lVar11,(v->field_1).string_.value._M_string_length + lVar11);
    (this->field_1).string_.format = (v->field_1).string_.format;
    break;
  case offset_datetime:
  case local_datetime:
  case local_time:
    vVar5 = (v->field_1).integer_.value;
    sVar6 = (v->field_1).string_.value._M_string_length;
    uVar7 = *(undefined8 *)((long)&(v->field_1).string_.value.field_2 + 8);
    (this->field_1).string_.value.field_2._M_allocated_capacity =
         (v->field_1).string_.value.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) = uVar7;
    (paVar1->integer_).value = vVar5;
    (this->field_1).string_.value._M_string_length = sVar6;
    break;
  case local_date:
    uVar10 = *(uint8_t *)((long)&v->field_1 + 5);
    *(uint8_t *)((long)&this->field_1 + 4) = *(uint8_t *)((long)&v->field_1 + 4);
    *(uint8_t *)((long)&this->field_1 + 5) = uVar10;
    (paVar1->offset_datetime_).value.date = (v->field_1).offset_datetime_.value.date;
    break;
  case array:
    __x = (vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           *)(v->field_1).integer_.value;
    this_01 = (vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               *)operator_new(0x18);
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::vector(this_01,__x);
    *(vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
      **)&this->field_1 = this_01;
    (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
    *(undefined4 *)((long)&this->field_1 + 0x10) = *(undefined4 *)((long)&v->field_1 + 0x10);
    break;
  case table:
    __ht = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)(v->field_1).integer_.value;
    this_00 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)operator_new(0x38);
    *(undefined8 *)this_00 = 0;
    *(size_type *)(this_00 + 8) = __ht->_M_bucket_count;
    *(undefined8 *)(this_00 + 0x10) = 0;
    *(size_type *)(this_00 + 0x18) = __ht->_M_element_count;
    sVar8 = (__ht->_M_rehash_policy)._M_next_resize;
    *(undefined8 *)(this_00 + 0x20) = *(undefined8 *)&__ht->_M_rehash_policy;
    *(size_t *)(this_00 + 0x28) = sVar8;
    *(undefined8 *)(this_00 + 0x30) = 0;
    local_38._M_h = (__hashtable_alloc *)this_00;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,true>>>>
              (this_00,__ht,&local_38);
    *(_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::type_config>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      **)&this->field_1 = this_00;
    sVar6 = (v->field_1).string_.value.field_2._M_allocated_capacity;
    (this->field_1).string_.value._M_string_length = (v->field_1).string_.value._M_string_length;
    (this->field_1).string_.value.field_2._M_allocated_capacity = sVar6;
    break;
  default:
    paVar1->empty_ = '\0';
  }
  return;
}

Assistant:

basic_value(const basic_value& v)
        : type_(v.type_), region_(v.region_), comments_(v.comments_)
    {
        switch(this->type_)
        {
            case value_t::boolean        : assigner(boolean_        , v.boolean_        ); break;
            case value_t::integer        : assigner(integer_        , v.integer_        ); break;
            case value_t::floating       : assigner(floating_       , v.floating_       ); break;
            case value_t::string         : assigner(string_         , v.string_         ); break;
            case value_t::offset_datetime: assigner(offset_datetime_, v.offset_datetime_); break;
            case value_t::local_datetime : assigner(local_datetime_ , v.local_datetime_ ); break;
            case value_t::local_date     : assigner(local_date_     , v.local_date_     ); break;
            case value_t::local_time     : assigner(local_time_     , v.local_time_     ); break;
            case value_t::array          : assigner(array_          , v.array_          ); break;
            case value_t::table          : assigner(table_          , v.table_          ); break;
            default                      : assigner(empty_          , '\0'              ); break;
        }
    }